

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createCompositeConstruct
          (Builder *this,Id typeId,vector<unsigned_int,_std::allocator<unsigned_int>_> *constituents
          )

{
  size_t this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *members;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Id IVar4;
  size_type sVar5;
  Instruction *this_01;
  const_reference pvVar6;
  bool local_bd;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_90;
  ulong local_88;
  size_t c;
  Instruction *op;
  const_iterator cStack_70;
  Op opcode;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  size_type local_50;
  size_t numConstituents;
  Builder *pBStack_40;
  bool replicate;
  uint *local_38;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *constituents_local;
  Builder *pBStack_18;
  Id typeId_local;
  Builder *this_local;
  
  local_28 = constituents;
  constituents_local._4_4_ = typeId;
  pBStack_18 = this;
  bVar1 = isAggregateType(this,typeId);
  bVar2 = true;
  if (!bVar1) {
    uVar3 = getNumTypeConstituents(this,constituents_local._4_4_);
    if (1 < uVar3) {
      uVar3 = getNumTypeConstituents(this,constituents_local._4_4_);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_28);
      bVar2 = true;
      if (uVar3 == sVar5) goto LAB_006dde3a;
    }
    bVar1 = isCooperativeVectorType(this,constituents_local._4_4_);
    bVar2 = false;
    if (bVar1) {
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_28);
      bVar2 = sVar5 == 1;
    }
  }
LAB_006dde3a:
  IVar4 = constituents_local._4_4_;
  members = local_28;
  if (bVar2) {
    if ((this->generatingOpCodeForSpecConst & 1U) == 0) {
      numConstituents._7_1_ = 0;
      local_50 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_28);
      if (((this->useReplicatedComposites & 1U) != 0) ||
         (bVar2 = isCooperativeVectorType(this,constituents_local._4_4_), bVar2)) {
        local_bd = false;
        if (local_50 != 0) {
          local_60._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(local_28);
          local_58 = __gnu_cxx::
                     __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator+(&local_60,1);
          local_68._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(local_28);
          cStack_70 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(local_28);
          local_bd = std::
                     equal<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                               (local_58,local_68,
                                (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 )cStack_70._M_current);
        }
        numConstituents._7_1_ = local_bd;
      }
      if ((numConstituents._7_1_ & 1) != 0) {
        local_50 = 1;
        addCapability(this,CapabilityReplicatedCompositesEXT);
        addExtension(this,"SPV_EXT_replicated_composites");
      }
      op._4_4_ = OpCompositeConstruct;
      if ((numConstituents._7_1_ & 1) != 0) {
        op._4_4_ = OpCompositeConstructReplicateEXT;
      }
      this_01 = (Instruction *)::operator_new(0x60);
      IVar4 = getUniqueId(this);
      spv::Instruction::Instruction(this_01,IVar4,constituents_local._4_4_,op._4_4_);
      c = (size_t)this_01;
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_28);
      spv::Instruction::reserveOperands(this_01,sVar5);
      for (local_88 = 0; this_00 = c, local_88 < local_50; local_88 = local_88 + 1) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (local_28,local_88);
        spv::Instruction::addIdOperand((Instruction *)this_00,*pvVar6);
      }
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_90,
                 (pointer)c);
      addInstruction(this,&local_90);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_90);
      this_local._4_4_ = spv::Instruction::getResultId((Instruction *)c);
    }
    else {
      local_30._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(local_28);
      local_38 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(local_28);
      pBStack_40 = this;
      bVar2 = std::
              any_of<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::__0>
                        (local_30,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   )local_38,(anon_class_8_1_8991fb9c_for__M_pred)this);
      this_local._4_4_ = makeCompositeConstant(this,IVar4,members,bVar2);
    }
    return this_local._4_4_;
  }
  __assert_fail("isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 && getNumTypeConstituents(typeId) == constituents.size()) || (isCooperativeVectorType(typeId) && constituents.size() == 1)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0xd89,"Id spv::Builder::createCompositeConstruct(Id, const std::vector<Id> &)");
}

Assistant:

Id Builder::createCompositeConstruct(Id typeId, const std::vector<Id>& constituents)
{
    assert(isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 &&
           getNumTypeConstituents(typeId) == constituents.size()) ||
           (isCooperativeVectorType(typeId) && constituents.size() == 1));

    if (generatingOpCodeForSpecConst) {
        // Sometime, even in spec-constant-op mode, the constant composite to be
        // constructed may not be a specialization constant.
        // e.g.:
        //  const mat2 m2 = mat2(a_spec_const, a_front_end_const, another_front_end_const, third_front_end_const);
        // The first column vector should be a spec constant one, as a_spec_const is a spec constant.
        // The second column vector should NOT be spec constant, as it does not contain any spec constants.
        // To handle such cases, we check the constituents of the constant vector to determine whether this
        // vector should be created as a spec constant.
        return makeCompositeConstant(typeId, constituents,
                                     std::any_of(constituents.begin(), constituents.end(),
                                                 [&](spv::Id id) { return isSpecConstant(id); }));
    }

    bool replicate = false;
    size_t numConstituents = constituents.size();

    if (useReplicatedComposites || isCooperativeVectorType(typeId)) {
        replicate = numConstituents > 0 &&
            std::equal(constituents.begin() + 1, constituents.end(), constituents.begin());
    }

    if (replicate) {
        numConstituents = 1;
        addCapability(spv::CapabilityReplicatedCompositesEXT);
        addExtension(spv::E_SPV_EXT_replicated_composites);
    }

    Op opcode = replicate ? OpCompositeConstructReplicateEXT : OpCompositeConstruct;

    Instruction* op = new Instruction(getUniqueId(), typeId, opcode);
    op->reserveOperands(constituents.size());
    for (size_t c = 0; c < numConstituents; ++c)
        op->addIdOperand(constituents[c]);
    addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}